

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QTabBar * __thiscall QMainWindowLayout::getTabBar(QMainWindowLayout *this)

{
  QMainWindowTabBar *this_00;
  QWidget *parent;
  long in_FS_OFFSET;
  QSet<QTabBar_*> local_58;
  undefined8 local_50;
  QObject local_40 [8];
  QMainWindowTabBar *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(long *)(this + 0x718) != 0) && (*(long *)(*(long *)(this + 0x718) + 8) != 0)) &&
     (this[0x810] == (QMainWindowLayout)0x0)) {
    QLayout::activate((QLayout *)this);
  }
  if (*(long *)(this + 0x730) == 0) {
    this_00 = (QMainWindowTabBar *)operator_new(0x40);
    parent = QLayout::parentWidget((QLayout *)this);
    QMainWindowTabBar::QMainWindowTabBar(this_00,(QMainWindow *)parent);
    local_38 = this_00;
    QTabBar::setDrawBase((QTabBar *)this_00,true);
    QTabBar::setElideMode((QTabBar *)this_00,ElideRight);
    QTabBar::setDocumentMode((QTabBar *)this_00,(bool)this[0x710]);
    QTabBar::setMovable((QTabBar *)this_00,true);
    QObject::connect(local_40,(char *)this_00,(QObject *)"2currentChanged(int)",(char *)this,
                     0x65e9d7);
    QMetaObject::Connection::~Connection((Connection *)local_40);
    local_58.q_hash.d = (Hash)tabMoved;
    local_50 = 0;
    QObject::connect<void(QTabBar::*)(int,int),void(QMainWindowLayout::*)(int,int)>
              ((Object *)&stack0xffffffffffffffb8,(offset_in_QTabBar_to_subr)this_00,
               (ContextType *)QTabBar::tabMoved,(offset_in_QMainWindowLayout_to_subr *)0x0,
               (ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffb8);
  }
  else {
    local_38 = (QMainWindowTabBar *)QList<QTabBar_*>::takeLast((QList<QTabBar_*> *)(this + 0x720));
  }
  QSet<QTabBar_*>::insert(&local_58,(QTabBar **)(this + 0x718));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QTabBar *)local_38;
  }
  __stack_chk_fail();
}

Assistant:

QTabBar *QMainWindowLayout::getTabBar()
{
    if (!usedTabBars.isEmpty() && !isInRestoreState) {
        /*
            If dock widgets have been removed and added while the main window was
            hidden, then the layout hasn't been activated yet, and tab bars from empty
            docking areas haven't been put in the cache yet.
        */
        activate();
    }

    QTabBar *result = nullptr;
    if (!unusedTabBars.isEmpty()) {
        result = unusedTabBars.takeLast();
    } else {
        result = new QMainWindowTabBar(static_cast<QMainWindow *>(parentWidget()));
        result->setDrawBase(true);
        result->setElideMode(Qt::ElideRight);
        result->setDocumentMode(_documentMode);
        result->setMovable(true);
        connect(result, SIGNAL(currentChanged(int)), this, SLOT(tabChanged()));
        connect(result, &QTabBar::tabMoved, this, &QMainWindowLayout::tabMoved);
    }

    usedTabBars.insert(result);
    return result;
}